

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_d.h
# Opt level: O2

void __thiscall
draco::VectorD<int,2>::VectorD<unsigned_int,2>
          (VectorD<int,_2> *this,VectorD<unsigned_int,_2> *src_vector)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    (this->v_)._M_elems[lVar1] = (src_vector->v_)._M_elems[lVar1];
  }
  return;
}

Assistant:

explicit VectorD(const VectorD<OtherScalarT, other_dimension_t> &src_vector) {
    for (int i = 0; i < dimension; ++i) {
      if (i < other_dimension_t) {
        v_[i] = Scalar(src_vector[i]);
      } else {
        v_[i] = Scalar(0);
      }
    }
  }